

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  pointer pcVar2;
  long lVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  initializer_list<char> __l;
  string value;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  vector<char,_std::allocator<char>_> delims;
  
  value._M_dataplus._M_p._0_2_ = 0x2227;
  __l._M_len = 2;
  __l._M_array = (iterator)&value;
  std::vector<char,_std::allocator<char>_>::vector(&delims,__l,(allocator_type *)local_68);
  trim(str);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    if (str->_M_string_length == 0) {
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&delims.super__Vector_base<char,_std::allocator<char>_>);
      return __return_storage_ptr__;
    }
    pcVar1 = (str->_M_dataplus)._M_p;
    if (*pcVar1 == '\"') {
      lVar3 = ::std::__cxx11::string::find((char)str,0x22);
      if (lVar3 == -1) {
        ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&value);
        ::std::__cxx11::string::~string((string *)&value);
        ::std::__cxx11::string::assign((char *)str);
      }
      else {
        ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&value);
        ::std::__cxx11::string::~string((string *)&value);
        ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
LAB_0010e008:
        ::std::__cxx11::string::operator=((string *)str,(string *)&value);
        ::std::__cxx11::string::~string((string *)&value);
      }
    }
    else if (*pcVar1 == '\'') {
      lVar3 = ::std::__cxx11::string::find((char)str,0x27);
      if (lVar3 != -1) {
        ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&value);
        ::std::__cxx11::string::~string((string *)&value);
        ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
        goto LAB_0010e008;
      }
      ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&value);
      ::std::__cxx11::string::~string((string *)&value);
      ::std::__cxx11::string::assign((char *)str);
    }
    else {
      _Var4 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string)::_lambda(char)_1_>>
                        (pcVar1,pcVar1 + str->_M_string_length);
      pcVar2 = (str->_M_dataplus)._M_p;
      if (_Var4._M_current == pcVar2 + str->_M_string_length) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,str);
        ::std::__cxx11::string::assign((char *)str);
      }
      else {
        value._M_dataplus._M_p = (pointer)&value.field_2;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&value,pcVar2,_Var4._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&value);
        local_68[0] = local_58;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_68,_Var4._M_current,
                   (str->_M_dataplus)._M_p + str->_M_string_length);
        ::std::__cxx11::string::operator=((string *)str,(string *)local_68);
        ::std::__cxx11::string::~string((string *)local_68);
        ::std::__cxx11::string::~string((string *)&value);
      }
    }
    trim(str);
  } while( true );
}

Assistant:

inline std::vector<std::string> split_up(std::string str) {

    std::vector<char> delims = {'\'', '\"'};
    auto find_ws = [](char ch) { return std::isspace<char>(ch, std::locale()); };
    trim(str);

    std::vector<std::string> output;

    while(!str.empty()) {
        if(str[0] == '\'') {
            auto end = str.find('\'', 1);
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else if(str[0] == '\"') {
            auto end = str.find('\"', 1);
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        trim(str);
    }

    return output;
}